

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnCatchAllExpr(BinaryReaderIR *this)

{
  Result RVar1;
  Location LStack_b8;
  Catch local_98;
  
  GetLocation(&LStack_b8,this);
  Catch::Catch(&local_98,&LStack_b8);
  RVar1 = AppendCatch(this,&local_98);
  Catch::~Catch(&local_98);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnCatchAllExpr() {
  return AppendCatch(Catch(GetLocation()));
}